

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t helper_macmulu_m68k(CPUM68KState_conflict *env,uint32_t op1,uint32_t op2)

{
  ulong local_20;
  uint64_t product;
  uint32_t op2_local;
  uint32_t op1_local;
  CPUM68KState_conflict *env_local;
  
  local_20 = (ulong)op1 * (ulong)op2;
  if ((local_20 & 0xffffff0000000000) != 0) {
    env->macsr = env->macsr | 2;
    if ((env->macsr & 0x80) == 0) {
      local_20 = local_20 & 0xffffffffff;
    }
    else {
      local_20 = 0x4000000000000;
    }
  }
  return local_20;
}

Assistant:

uint64_t HELPER(macmulu)(CPUM68KState *env, uint32_t op1, uint32_t op2)
{
    uint64_t product;

    product = (uint64_t)op1 * op2;
    if (product & (0xffffffull << 40)) {
        env->macsr |= MACSR_V;
        if (env->macsr & MACSR_OMC) {
            /* Make sure the accumulate operation overflows.  */
            product = 1ll << 50;
        } else {
            product &= ((1ull << 40) - 1);
        }
    }
    return product;
}